

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O2

void hprime_final(ssh_hash *h,uint length,void *vout)

{
  uint hashlen;
  uint8_t hashbuf [64];
  
  while (0x40 < length) {
    ssh_hash_final(h,hashbuf);
    *(undefined8 *)((long)vout + 0x10) = hashbuf._16_8_;
    *(undefined8 *)((long)vout + 0x18) = hashbuf._24_8_;
    *(undefined8 *)vout = hashbuf._0_8_;
    *(undefined8 *)((long)vout + 8) = hashbuf._8_8_;
    vout = (void *)((long)vout + 0x20);
    length = length - 0x20;
    hashlen = 0x40;
    if (length < 0x40) {
      hashlen = length;
    }
    h = blake2b_new_general(hashlen);
    BinarySink_put_data(h->binarysink_,hashbuf,0x40);
    smemclr(hashbuf,0x40);
  }
  ssh_hash_final(h,(uchar *)vout);
  return;
}

Assistant:

static void hprime_final(ssh_hash *h, unsigned length, void *vout)
{
    uint8_t *out = (uint8_t *)vout;

    while (length > 64) {
        uint8_t hashbuf[64];
        ssh_hash_final(h, hashbuf);

        memcpy(out, hashbuf, 32);
        out += 32;
        length -= 32;

        h = blake2b_new_general(length > 64 ? 64 : length);
        put_data(h, hashbuf, 64);

        smemclr(hashbuf, sizeof(hashbuf));
    }

    ssh_hash_final(h, out);
}